

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

char * cs_md5(char *buf,...)

{
  byte bVar1;
  char in_AL;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 in_RCX;
  void **ppvVar5;
  void **ppvVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uchar hash [16];
  void **local_150;
  byte local_138 [16];
  MD5_CTX local_128;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_128.A = 0x67452301;
  local_128.B = 0xefcdab89;
  local_128.C = 0x98badcfe;
  local_128.D = 0x10325476;
  local_128.Nl = 0;
  local_128.Nh = 0;
  uVar2 = 8;
  local_150 = &ap[0].overflow_arg_area;
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while( true ) {
    uVar3 = (ulong)uVar2;
    if (uVar3 < 0x29) {
      ppvVar5 = (void **)((long)local_c8 + uVar3);
      uVar2 = uVar2 + 8;
      uVar3 = (ulong)uVar2;
    }
    else {
      ppvVar5 = local_150;
      local_150 = local_150 + 1;
    }
    if (*ppvVar5 == (void *)0x0) break;
    if ((uint)uVar3 < 0x29) {
      uVar2 = (uint)uVar3 + 8;
      ppvVar6 = (void **)((long)local_c8 + uVar3);
    }
    else {
      ppvVar6 = local_150;
      local_150 = local_150 + 1;
    }
    MD5_Update(&local_128,*ppvVar5,(size_t)*ppvVar6);
  }
  MD5_Final(local_138,&local_128);
  lVar4 = 0;
  do {
    bVar1 = local_138[lVar4];
    buf[lVar4 * 2] = "0123456789abcdef"[bVar1 >> 4];
    buf[lVar4 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  buf[0x20] = '\0';
  return buf;
}

Assistant:

char *cs_md5(char buf[33], ...) {
    unsigned char hash[16];
    const unsigned char *p;
    va_list ap;
    MD5_CTX ctx;

    MD5_Init(&ctx);

    va_start(ap, buf);
    while ((p = va_arg(ap, const unsigned char *)) != NULL) {
        size_t len = va_arg(ap, size_t);
        MD5_Update(&ctx, p, len);
    }
    va_end(ap);

    MD5_Final(hash, &ctx);
    cs_to_hex(buf, hash, sizeof(hash));

    return buf;
}